

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O1

char * __thiscall Quartet::index(Quartet *this,char *__s,int __c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  
  pcVar4 = Doublet::index(&this->bra,__s,__c);
  iVar1 = (this->ket).left.ijk._M_elems[2];
  iVar2 = (this->ket).left.ijk._M_elems[1] + (this->ket).left.ijk._M_elems[0];
  iVar3 = (this->ket).right.ijk._M_elems[1] + (this->ket).right.ijk._M_elems[0];
  iVar6 = (this->ket).right.ijk._M_elems[2];
  uVar7 = iVar6 + iVar3 + 1;
  iVar6 = (int)((iVar3 + iVar6 + 2) * uVar7) / 2;
  pcVar5 = Doublet::index(&this->ket,(char *)(ulong)uVar7,iVar6);
  return (char *)(ulong)(uint)((int)pcVar5 +
                              (int)pcVar4 * (((iVar2 + iVar1 + 2) * (iVar1 + iVar2 + 1)) / 2) *
                              iVar6);
}

Assistant:

int index(void) const { return bra.index() * ket.ncart() + ket.index(); }